

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_bagwell.h
# Opt level: O0

void __thiscall
vector_bagwell<unsigned_long,_16U>::~vector_bagwell(vector_bagwell<unsigned_long,_16U> *this)

{
  size_type sVar1;
  reference ppuVar2;
  undefined4 local_14;
  uint i;
  vector_bagwell<unsigned_long,_16U> *this_local;
  
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::size
                      (&this->_index_block);
    if (sVar1 <= local_14) break;
    ppuVar2 = std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::operator[]
                        (&this->_index_block,(ulong)local_14);
    free(*ppuVar2);
    local_14 = local_14 + 1;
  }
  std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::~vector(&this->_index_block);
  return;
}

Assistant:

~vector_bagwell()
	{
		for (unsigned i=0; i < _index_block.size(); ++i)
			free(_index_block[i]);
	}